

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O2

void vocterm(voccxdef *ctx)

{
  free(ctx->voccxfus);
  free(ctx->voccxdmn);
  free(ctx->voccxalm);
  free(ctx->voc_stk_ptr);
  return;
}

Assistant:

void vocterm(voccxdef *ctx)
{
    /* delete the fuses, daemons, and notifiers */
    voctermfree(ctx->voccxfus);
    voctermfree(ctx->voccxdmn);
    voctermfree(ctx->voccxalm);

    /* delete the private stack */
    if (ctx->voc_stk_ptr != 0)
        mchfre(ctx->voc_stk_ptr);
}